

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdfx.c
# Opt level: O0

void gdImageSharpen(gdImagePtr im,int pct)

{
  int iVar1;
  int iVar2;
  float outer_coeff_00;
  int iVar3;
  int iVar4;
  float inner_coeff_00;
  int nc_1;
  int c_2;
  int c_1;
  int pc_1;
  int nc;
  int c;
  int pc;
  float outer_coeff;
  float inner_coeff;
  int sy;
  int sx;
  int y;
  int x;
  int pct_local;
  gdImagePtr im_local;
  
  iVar1 = im->sx;
  iVar2 = im->sy;
  outer_coeff_00 = (float)-pct / 400.0;
  inner_coeff_00 = 1.0 - (outer_coeff_00 + outer_coeff_00);
  if ((im->trueColor != 0) && (0 < pct)) {
    for (sx = 0; sx < iVar1; sx = sx + 1) {
      nc = gdImageGetPixel(im,sx,0);
      for (sy = 0; sy < iVar2 + -1; sy = sy + 1) {
        iVar3 = gdImageGetPixel(im,sx,sy);
        iVar4 = gdImageGetTrueColorPixel(im,sx,sy + 1);
        iVar4 = gdImageSubSharpen(nc,iVar3,iVar4,inner_coeff_00,outer_coeff_00);
        gdImageSetPixel(im,sx,sy,iVar4);
        nc = iVar3;
      }
      iVar3 = gdImageGetPixel(im,sx,sy);
      iVar3 = gdImageSubSharpen(nc,iVar3,iVar3,inner_coeff_00,outer_coeff_00);
      gdImageSetPixel(im,sx,sy,iVar3);
    }
    for (sy = 0; sy < iVar2; sy = sy + 1) {
      c_2 = gdImageGetPixel(im,0,sy);
      for (sx = 0; sx < iVar1 + -1; sx = sx + 1) {
        iVar3 = gdImageGetPixel(im,sx,sy);
        iVar4 = gdImageGetTrueColorPixel(im,sx + 1,sy);
        iVar4 = gdImageSubSharpen(c_2,iVar3,iVar4,inner_coeff_00,outer_coeff_00);
        gdImageSetPixel(im,sx,sy,iVar4);
        c_2 = iVar3;
      }
      iVar3 = gdImageGetPixel(im,sx,sy);
      iVar3 = gdImageSubSharpen(c_2,iVar3,iVar3,inner_coeff_00,outer_coeff_00);
      gdImageSetPixel(im,sx,sy,iVar3);
    }
  }
  return;
}

Assistant:

BGD_DECLARE(void)
gdImageSharpen (gdImagePtr im, int pct)
{
	int x, y;
	int sx, sy;
	float inner_coeff, outer_coeff;

	sx = im->sx;
	sy = im->sy;

	/* Must sum to 1 to avoid overall change in brightness.
	 * Scaling chosen so that pct=100 gives 1-D filter [-1 6 -1]/4,
	 * resulting in a 2-D filter [1 -6 1; -6 36 -6; 1 -6 1]/16,
	 * which gives noticeable, but not excessive, sharpening
	 */

	outer_coeff = -pct / 400.0;
	inner_coeff = 1 - 2 * outer_coeff;

	/* Don't try to do anything with non-truecolor images, as
	   pointless,
	   * nor for pct<=0, as small kernel size leads to nasty
	   artefacts when blurring
	 */
	if ((im->trueColor) && (pct > 0)) {

		/* First pass, 1-D convolution column-wise */
		for (x = 0; x < sx; x++) {

			/* pc is colour of previous pixel; c of the
			   current pixel and nc of the next */
			int pc, c, nc;

			/* Replicate edge pixel at image boundary */
			pc = gdImageGetPixel (im, x, 0);

			/* Stop looping before last pixel to avoid
			   conditional within loop */
			for (y = 0; y < sy - 1; y++) {

				c = gdImageGetPixel (im, x, y);

				nc = gdImageGetTrueColorPixel (im, x, y + 1);

				/* Update centre pixel to new colour */
				gdImageSetPixel (im, x, y,
				                 gdImageSubSharpen (pc, c, nc, inner_coeff,
				                                    outer_coeff));

				/* Save original colour of current
				   pixel for next time round */
				pc = c;
			}

			/* Deal with last pixel, replicating current
			   pixel at image boundary */
			c = gdImageGetPixel (im, x, y);
			gdImageSetPixel (im, x, y, gdImageSubSharpen
			                 (pc, c, c, inner_coeff, outer_coeff));
		}

		/* Second pass, 1-D convolution row-wise */
		for (y = 0; y < sy; y++) {
			int pc, c;
			pc = gdImageGetPixel (im, 0, y);
			for (x = 0; x < sx - 1; x++) {
				int c, nc;
				c = gdImageGetPixel (im, x, y);
				nc = gdImageGetTrueColorPixel (im, x + 1, y);
				gdImageSetPixel (im, x, y,
				                 gdImageSubSharpen (pc, c, nc, inner_coeff,
				                                    outer_coeff));
				pc = c;
			}
			c = gdImageGetPixel (im, x, y);
			gdImageSetPixel (im, x, y, gdImageSubSharpen
			                 (pc, c, c, inner_coeff, outer_coeff));
		}
	}
}